

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_trs.cc
# Opt level: O2

int X509_check_trust(X509 *x,int id,int flags)

{
  int iVar1;
  X509_TRUST *pXVar2;
  int extraout_EDX;
  X509_TRUST *trust;
  
  if (id == -1) {
    iVar1 = 1;
  }
  else {
    if (id != 0) {
      pXVar2 = X509_TRUST_get0(id);
      if (pXVar2 != (X509_TRUST *)0x0) {
        iVar1 = (*pXVar2->check_trust)(pXVar2,x,extraout_EDX);
        return iVar1;
      }
      iVar1 = obj_trust(id,(X509 *)x);
      return iVar1;
    }
    trust = (X509_TRUST *)0x38e;
    iVar1 = obj_trust(0x38e,(X509 *)x);
    if (iVar1 == 3) {
      iVar1 = trust_compat(trust,(X509 *)x);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int X509_check_trust(X509 *x, int id, int flags) {
  if (id == -1) {
    return X509_TRUST_TRUSTED;
  }
  // We get this as a default value
  if (id == 0) {
    int rv = obj_trust(NID_anyExtendedKeyUsage, x);
    if (rv != X509_TRUST_UNTRUSTED) {
      return rv;
    }
    return trust_compat(NULL, x);
  }
  const X509_TRUST *pt = X509_TRUST_get0(id);
  if (pt == NULL) {
    // Unknown trust IDs are silently reintrepreted as NIDs. This is unreachable
    // from the certificate verifier itself, but wpa_supplicant relies on it.
    // Note this relies on commonly-used NIDs and trust IDs not colliding.
    return obj_trust(id, x);
  }
  return pt->check_trust(pt, x);
}